

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O1

double __thiscall LSL_RLEZ<TTA>::Alloc(LSL_RLEZ<TTA> *this)

{
  size_t __n;
  double dVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  int *piVar6;
  ulong cols;
  ulong uVar7;
  size_t rows;
  size_t __n_00;
  size_t __n_01;
  size_t cols_00;
  size_t __n_02;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar3->field_0x8;
  iVar8 = *(int *)&pMVar3->field_0xc;
  dVar9 = TTA::Alloc(((iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1) *
                     ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1,
                     &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  lVar5 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar5;
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar6,piVar6[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar3->field_0x8;
  rows = (size_t)iVar2;
  cols_00 = (size_t)*(int *)&pMVar3->field_0xc;
  Table2D::Reserve(&this->ER,rows,cols_00);
  cols = cols_00 + 1 & 0xfffffffffffffffe;
  Table2D::Reserve(&this->RLC,rows + 1,cols);
  __n = rows * 4;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (long)rows) {
    uVar7 = __n;
  }
  piVar6 = (int *)operator_new__(uVar7);
  this->ner = piVar6;
  iVar8 = (int)(cols_00 + 1);
  Table2D::Reserve(&this->ERA,rows,(long)iVar8);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  __n_02 = cols_00 * rows * 4;
  memset(*(this->ER).prows,0,__n_02);
  __n_01 = (long)((int)cols * (int)(rows + 1)) << 2;
  memset(*(this->RLC).prows,0,__n_01);
  memset(this->ner,0,__n);
  __n_00 = (long)(iVar8 * iVar2) << 2;
  memset(*(this->ERA).prows,0,__n_00);
  lVar5 = cv::getTickCount();
  dVar11 = (double)lVar5 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar11;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar11;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  lVar5 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar5;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  memset(*(this->ER).prows,0,__n_02);
  memset(*(this->RLC).prows,0,__n_01);
  memset(this->ner,0,__n);
  memset(*(this->ERA).prows,0,__n_00);
  lVar5 = cv::getTickCount();
  dVar10 = (double)lVar5 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar10;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar10;
  return dVar9 + ((dVar11 * 1000.0) / dVar1 -
                 (dVar10 * 1000.0) /
                 (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                 tick_frequency_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image and for other structures
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());

        int rows = img_.rows;
        int cols = img_.cols;

        ER.Reserve(rows, cols); // Matrix of relative label (1 label/pixel)

        // Notes on the RLC table:
        // 1) rows: +1 in order to handle compact usage of RLC table without if statements,
        // 2) columns: MISSING in the paper, RLC requires 2 values/run in row, so width must be next multiple of 2.
        RLC.Reserve(rows + 1, (cols + 1) & ~1);

        ner = new int[rows]; //vector<int> ner(rows); // Number of runs 

        ERA.Reserve(rows, cols + 1); // MISSING in the paper: ERA must have one column more than the input image 
        // in order to handle special cases (e.g. lines with chessboard pattern 
        // starting with a foreground pixel) 

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }